

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::readToken(OurReader *this,Token *token)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  byte *pbVar5;
  char *pcVar6;
  Location pCVar7;
  long lVar8;
  
  pbVar5 = (byte *)this->current_;
  while (((pbVar5 != (byte *)this->end_ && ((ulong)*pbVar5 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
    pbVar5 = pbVar5 + 1;
    this->current_ = (Location)pbVar5;
  }
  token->start_ = (Location)pbVar5;
  pbVar5 = (byte *)this->current_;
  if (pbVar5 == (byte *)this->end_) {
LAB_0012b902:
    token->type_ = tokenEndOfStream;
    goto LAB_0012b908;
  }
  this->current_ = (Location)(pbVar5 + 1);
  bVar1 = *pbVar5;
  if (0x5a < bVar1) {
    if (bVar1 < 0x6e) {
      if (bVar1 == 0x5b) {
        token->type_ = tokenArrayBegin;
      }
      else {
        if (bVar1 != 0x5d) {
          if (bVar1 == 0x66) {
            token->type_ = tokenFalse;
            pCVar7 = this->current_;
            if (3 < (long)this->end_ - (long)pCVar7) {
              lVar8 = 3;
              do {
                if (lVar8 == -1) {
                  pcVar6 = pCVar7 + 4;
                  goto LAB_0012bb81;
                }
                pcVar6 = pCVar7 + lVar8;
                lVar2 = lVar8 + 1;
                lVar8 = lVar8 + -1;
              } while (*pcVar6 == "false"[lVar2]);
            }
          }
          goto switchD_0012b7f4_caseD_23;
        }
        token->type_ = tokenArrayEnd;
      }
    }
    else {
      if (bVar1 < 0x7b) {
        if (bVar1 == 0x6e) {
          token->type_ = tokenNull;
          pCVar7 = this->current_;
          if (2 < (long)this->end_ - (long)pCVar7) {
            lVar8 = 2;
            do {
              if (lVar8 == -1) goto LAB_0012bb1a;
              pcVar6 = pCVar7 + lVar8;
              lVar2 = lVar8 + 1;
              lVar8 = lVar8 + -1;
            } while (*pcVar6 == "null"[lVar2]);
          }
        }
        else if (bVar1 == 0x74) {
          token->type_ = tokenTrue;
          pCVar7 = this->current_;
          if (2 < (long)this->end_ - (long)pCVar7) {
            lVar8 = 2;
            do {
              if (lVar8 == -1) goto LAB_0012bb1a;
              pcVar6 = pCVar7 + lVar8;
              lVar2 = lVar8 + 1;
              lVar8 = lVar8 + -1;
            } while (*pcVar6 == "true"[lVar2]);
          }
        }
        goto switchD_0012b7f4_caseD_23;
      }
      if (bVar1 == 0x7d) {
        token->type_ = tokenObjectEnd;
      }
      else {
        if (bVar1 != 0x7b) goto switchD_0012b7f4_caseD_23;
        token->type_ = tokenObjectBegin;
      }
    }
    goto LAB_0012b908;
  }
  switch(bVar1) {
  case 0x22:
    token->type_ = tokenString;
    bVar4 = readString(this);
    goto LAB_0012b9dc;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2e:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
    break;
  case 0x27:
    if ((this->features_).allowSingleQuotes_ == true) {
      token->type_ = tokenString;
      bVar4 = readStringSingleQuote(this);
      goto LAB_0012b9dc;
    }
    break;
  case 0x2b:
    bVar4 = readNumber(this,true);
    if (bVar4) {
LAB_0012ba02:
      token->type_ = tokenNumber;
      goto LAB_0012b908;
    }
    token->type_ = tokenPosInf;
    if (((this->features_).allowSpecialFloats_ == true) &&
       (pCVar7 = this->current_, 6 < (long)this->end_ - (long)pCVar7)) {
      lVar8 = 6;
      do {
        if (lVar8 == -1) goto LAB_0012bb77;
        pcVar6 = pCVar7 + lVar8;
        lVar2 = lVar8 + 2;
        lVar8 = lVar8 + -1;
      } while (*pcVar6 == "-Infinity"[lVar2]);
    }
    break;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_0012b908;
  case 0x2d:
    bVar4 = readNumber(this,true);
    if (bVar4) goto LAB_0012ba02;
    token->type_ = tokenNegInf;
    if (((this->features_).allowSpecialFloats_ == true) &&
       (pCVar7 = this->current_, 6 < (long)this->end_ - (long)pCVar7)) {
      lVar8 = 6;
      do {
        if (lVar8 == -1) goto LAB_0012bb77;
        pcVar6 = pCVar7 + lVar8;
        lVar2 = lVar8 + 2;
        lVar8 = lVar8 + -1;
      } while (*pcVar6 == "-Infinity"[lVar2]);
    }
    break;
  case 0x2f:
    token->type_ = tokenComment;
    bVar4 = readComment(this);
LAB_0012b9dc:
    bVar3 = true;
    if (bVar4 != false) goto LAB_0012b90a;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this,false);
    goto LAB_0012b908;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
LAB_0012b908:
    bVar3 = true;
    goto LAB_0012b90a;
  case 0x49:
    if ((this->features_).allowSpecialFloats_ == true) {
      token->type_ = tokenPosInf;
      pCVar7 = this->current_;
      if (6 < (long)this->end_ - (long)pCVar7) {
        lVar8 = 6;
        do {
          if (lVar8 == -1) goto LAB_0012bb77;
          pcVar6 = pCVar7 + lVar8;
          lVar2 = lVar8 + 2;
          lVar8 = lVar8 + -1;
        } while (*pcVar6 == "-Infinity"[lVar2]);
      }
    }
    break;
  case 0x4e:
    if ((this->features_).allowSpecialFloats_ == true) {
      token->type_ = tokenNaN;
      pcVar6 = this->current_;
      if (((1 < (long)this->end_ - (long)pcVar6) && (pcVar6[1] == 'N')) && (*pcVar6 == 'a')) {
        pcVar6 = pcVar6 + 2;
        goto LAB_0012bb81;
      }
    }
    break;
  default:
    if (bVar1 == 0) goto LAB_0012b902;
  }
switchD_0012b7f4_caseD_23:
  token->type_ = tokenError;
  bVar3 = false;
LAB_0012b90a:
  token->end_ = this->current_;
  return bVar3;
LAB_0012bb1a:
  pcVar6 = pCVar7 + 3;
  goto LAB_0012bb81;
LAB_0012bb77:
  pcVar6 = pCVar7 + 7;
LAB_0012bb81:
  this->current_ = pcVar6;
  goto LAB_0012b908;
}

Assistant:

bool OurReader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '\'':
    if (features_.allowSingleQuotes_) {
      token.type_ = tokenString;
      ok = readStringSingleQuote();
    } else {
      // If we don't allow single quotes, this is a failure case.
      ok = false;
    }
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    token.type_ = tokenNumber;
    readNumber(false);
    break;
  case '-':
    if (readNumber(true)) {
      token.type_ = tokenNumber;
    } else {
      token.type_ = tokenNegInf;
      ok = features_.allowSpecialFloats_ && match("nfinity", 7);
    }
    break;
  case '+':
    if (readNumber(true)) {
      token.type_ = tokenNumber;
    } else {
      token.type_ = tokenPosInf;
      ok = features_.allowSpecialFloats_ && match("nfinity", 7);
    }
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case 'N':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenNaN;
      ok = match("aN", 2);
    } else {
      ok = false;
    }
    break;
  case 'I':
    if (features_.allowSpecialFloats_) {
      token.type_ = tokenPosInf;
      ok = match("nfinity", 7);
    } else {
      ok = false;
    }
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return ok;
}